

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void ActionUnserialize::
     SerReadWriteMany<AutoFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
               (AutoFile *s,int *args,uint256 *args_1,uint256 *args_2,uint *args_3,uint *args_4,
               uint *args_5)

{
  long lVar1;
  AutoFile *in_RCX;
  uint *in_RDI;
  int *in_R8;
  uint256 *in_R9;
  long in_FS_OFFSET;
  uint *in_stack_00000008;
  uint256 *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UnserializeMany<AutoFile,int&,uint256&,uint256&,unsigned_int&,unsigned_int&,unsigned_int&>
            (in_RCX,in_R8,in_R9,in_stack_ffffffffffffffc0,in_stack_00000008,(uint *)0xf9c2b7,in_RDI)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }